

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.c
# Opt level: O0

int ASN1_TYPE_set_octetstring(ASN1_TYPE *a,uchar *data,int len)

{
  int iVar1;
  ASN1_OCTET_STRING *str;
  ASN1_STRING *os;
  undefined4 local_4;
  
  str = ASN1_OCTET_STRING_new();
  if (str == (ASN1_OCTET_STRING *)0x0) {
    local_4 = 0;
  }
  else {
    iVar1 = ASN1_OCTET_STRING_set(str,data,len);
    if (iVar1 == 0) {
      ASN1_OCTET_STRING_free(str);
      local_4 = 0;
    }
    else {
      ASN1_TYPE_set(a,4,str);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ASN1_TYPE_set_octetstring(ASN1_TYPE *a, unsigned char *data, int len)
{
    ASN1_STRING *os;

    if ((os = ASN1_OCTET_STRING_new()) == NULL)
        return 0;
    if (!ASN1_OCTET_STRING_set(os, data, len)) {
        ASN1_OCTET_STRING_free(os);
        return 0;
    }
    ASN1_TYPE_set(a, V_ASN1_OCTET_STRING, os);
    return 1;
}